

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O1

void __thiscall
duckdb::AlpCompressionState<double>::CompressVector(AlpCompressionState<double> *this)

{
  atomic<unsigned_long> *paVar1;
  idx_t iVar2;
  __int_type _Var3;
  idx_t i;
  idx_t iVar4;
  pointer pCVar5;
  ulong uVar6;
  idx_t i_1;
  double dVar7;
  
  iVar2 = this->nulls_idx;
  if (iVar2 != 0) {
    dVar7 = 0.0;
    if (this->vector_idx != 0) {
      uVar6 = 0;
      do {
        if (uVar6 != this->vector_null_positions[uVar6]) {
          dVar7 = this->input_vector[uVar6];
          break;
        }
        uVar6 = uVar6 + 1;
      } while (this->vector_idx != uVar6);
    }
    iVar4 = 0;
    do {
      this->input_vector[this->vector_null_positions[iVar4]] = dVar7;
      iVar4 = iVar4 + 1;
    } while (iVar2 != iVar4);
  }
  alp::AlpCompression<double,_false>::Compress
            (this->input_vector,this->vector_idx,this->vector_null_positions,iVar2,&this->state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  if (this->metadata_ptr + -4 <=
      ((this->handle).node.ptr)->buffer +
      (this->data_bytes_used + (this->state).bp_size + (ulong)(this->state).exceptions_count * 10 +
       0x18 & 0xfffffffffffffff8)) {
    pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    iVar2 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var3 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var3 + iVar2);
  }
  if (this->vector_idx != 0 && this->vector_idx != this->nulls_idx) {
    uVar6 = 0;
    do {
      pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      BaseStatistics::UpdateNumericStats<double>
                (&(pCVar5->stats).statistics,this->input_vector[uVar6]);
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->vector_idx);
  }
  iVar2 = this->vector_idx;
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + iVar2;
  UNLOCK();
  FlushVector(this);
  return;
}

Assistant:

void CompressVector() {
		if (nulls_idx) {
			alp::AlpUtils::FindAndReplaceNullsInVector<T>(input_vector, vector_null_positions, vector_idx, nulls_idx);
		}
		alp::AlpCompression<T, false>::Compress(input_vector, vector_idx, vector_null_positions, nulls_idx, state);
		//! Check if the compressed vector fits on current segment
		if (!HasEnoughSpace()) {
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}

		if (vector_idx != nulls_idx) { //! At least there is one valid value in the vector
			for (idx_t i = 0; i < vector_idx; i++) {
				current_segment->stats.statistics.UpdateNumericStats<T>(input_vector[i]);
			}
		}
		current_segment->count += vector_idx;
		FlushVector();
	}